

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_strscan.c
# Opt level: O3

StrScanFmt lj_strscan_scan(uint8_t *p,MSize len,TValue *o,uint32_t opt)

{
  double dVar1;
  uint uVar2;
  int iVar3;
  int iVar4;
  StrScanFmt SVar5;
  uint32_t uVar6;
  long lVar7;
  uint64_t uVar8;
  uint ex2;
  int iVar9;
  byte *pbVar10;
  int iVar11;
  uint dig;
  byte *pbVar12;
  uint uVar13;
  byte bVar14;
  ulong uVar15;
  byte bVar16;
  uint uVar17;
  long lVar18;
  byte *pbVar19;
  uint uVar20;
  uint uVar21;
  bool bVar22;
  bool bVar23;
  double n;
  lua_Number lVar24;
  uint local_48;
  
  pbVar12 = p + len;
  bVar14 = *p;
  bVar22 = false;
  pbVar19 = p;
  if ((""[(ulong)bVar14 + 1] & 8) == 0) {
    do {
      p = pbVar19;
      bVar14 = *p;
      pbVar19 = p + 1;
    } while ((""[(ulong)bVar14 + 1] & 2) != 0);
    if ((bVar14 == 0x2b) || (bVar14 == 0x2d)) {
      local_48 = (uint)(bVar14 == 0x2d);
      bVar14 = *pbVar19;
      p = pbVar19;
    }
    else {
      local_48 = 0;
    }
    if (0x40 < bVar14) {
      uVar8 = 0xfff8000000000000;
      pbVar19 = p;
      if ((bVar14 & 0xdf) == 0x4e) {
        if ((p[1] & 0xdf) == 0x41) {
          pbVar19 = p + (ulong)((p[2] & 0xdf) == 0x4e) * 3;
        }
      }
      else if ((((bVar14 & 0xdf) == 0x49) && ((p[1] & 0xdf) == 0x4e)) && ((p[2] & 0xdf) == 0x46)) {
        uVar8 = 0xfff0000000000000;
        if (local_48 == 0) {
          uVar8 = 0x7ff0000000000000;
        }
        pbVar10 = p + 3;
        pbVar19 = pbVar10;
        if (((((p[3] & 0xdf) == 0x49) && ((p[4] & 0xdf) == 0x4e)) && ((p[5] & 0xdf) == 0x49)) &&
           (((p[6] & 0xdf) == 0x54 && (pbVar19 = p + 8, (p[7] & 0xdf) != 0x59)))) {
          pbVar19 = pbVar10;
        }
      }
      pbVar19 = pbVar19 + -1;
      do {
        pbVar10 = pbVar19 + 1;
        pbVar19 = pbVar19 + 1;
      } while ((""[(ulong)*pbVar10 + 1] & 2) != 0);
      if (pbVar19 < pbVar12 || *pbVar10 != 0) {
        return STRSCAN_ERROR;
      }
      goto LAB_0011b528;
    }
  }
  else {
    local_48 = 0;
  }
  uVar13 = (uint)bVar14;
  uVar20 = 10;
  if (bVar14 == 0x30) {
    uVar20 = 0;
  }
  if ((opt & 0x10) == 0) {
    uVar20 = 10;
  }
  if (bVar14 < 0x31) {
    bVar16 = 8;
    if (bVar14 == 0x30) {
      if ((p[1] | 0x20) == 0x62) {
        p = p + 2;
        uVar20 = 2;
      }
      else if ((p[1] | 0x20) == 0x78) {
        p = p + 2;
        bVar16 = 0x10;
        uVar20 = 0x10;
      }
    }
    pbVar19 = (byte *)0x0;
    do {
      uVar13 = (uint)*p;
      if (uVar13 == 0x30) {
        bVar22 = true;
      }
      else {
        if (uVar13 != 0x2e) goto LAB_0011b25e;
        bVar23 = pbVar19 != (byte *)0x0;
        pbVar19 = p;
        if (bVar23) {
          return STRSCAN_ERROR;
        }
      }
      p = p + 1;
    } while( true );
  }
  bVar16 = 8;
  pbVar19 = (byte *)0x0;
LAB_0011b25e:
  iVar9 = -(int)p;
  lVar7 = 0;
  uVar15 = (ulong)uVar13;
  dig = 0;
  uVar21 = 0;
  do {
    bVar14 = (byte)uVar15;
    if ((bVar16 & ""[uVar15 + 1]) == 0) {
      if (bVar14 != 0x2e) {
        if (!bVar22 && dig == 0) {
          return STRSCAN_ERROR;
        }
        if (pbVar19 == (byte *)0x0) {
          SVar5 = STRSCAN_INT;
        }
        else {
          if (uVar20 == 2) {
            return STRSCAN_ERROR;
          }
          SVar5 = STRSCAN_NUM;
          if (dig != 0) {
            iVar3 = (int)pbVar19;
            iVar4 = (int)lVar7;
            uVar17 = ((iVar9 + iVar3) - iVar4) + 1;
            if (-1 < (int)uVar17) goto LAB_0011b382;
            iVar11 = (iVar3 + iVar9) - iVar4;
            lVar18 = 0;
            break;
          }
          dig = 0;
        }
        ex2 = 0;
        goto LAB_0011b392;
      }
      if (pbVar19 != (byte *)0x0) {
        return STRSCAN_ERROR;
      }
      pbVar19 = p + lVar7;
    }
    else {
      uVar21 = (uint)(bVar14 & 0xf) + uVar21 * 10;
      dig = dig + 1;
    }
    uVar15 = (ulong)p[lVar7 + 1];
    lVar7 = lVar7 + 1;
  } while( true );
  while( true ) {
    dig = dig - 1;
    lVar18 = lVar18 + -1;
    iVar11 = iVar11 + 1;
    if (-2 < iVar11) break;
    if (p[lVar7 + -1 + lVar18] != 0x30) {
      uVar17 = (((iVar3 + iVar9) - iVar4) + 1) - (int)lVar18;
      if (uVar17 < 0xfff00001) {
        return STRSCAN_ERROR;
      }
      goto LAB_0011b382;
    }
  }
  uVar17 = 0;
LAB_0011b382:
  ex2 = uVar17 * 4;
  if (uVar20 != 0x10) {
    ex2 = uVar17;
  }
LAB_0011b392:
  pbVar19 = p + lVar7;
  if (9 < uVar20) {
    bVar16 = 0x65;
    if (uVar20 == 0x10) {
      bVar16 = 0x70;
    }
    if (bVar16 == (bVar14 | 0x20)) {
      bVar14 = p[lVar7 + 1];
      if ((bVar14 == 0x2b) || (bVar14 == 0x2d)) {
        pbVar19 = p + lVar7 + 2;
        bVar22 = bVar14 != 0x2d;
        bVar14 = *pbVar19;
      }
      else {
        pbVar19 = p + lVar7 + 1;
        bVar22 = true;
      }
      if ((""[(ulong)bVar14 + 1] & 8) == 0) {
        return STRSCAN_ERROR;
      }
      uVar17 = (uint)(bVar14 & 0xf);
      while( true ) {
        pbVar19 = pbVar19 + 1;
        bVar14 = *pbVar19;
        if ((""[(ulong)bVar14 + 1] & 8) == 0) break;
        uVar17 = (bVar14 & 0xf) + uVar17 * 10;
        if (0xfffff < uVar17) {
          return STRSCAN_ERROR;
        }
      }
      uVar2 = -uVar17;
      if (bVar22) {
        uVar2 = uVar17;
      }
      ex2 = ex2 + uVar2;
      SVar5 = STRSCAN_NUM;
    }
  }
  if (bVar14 != 0) {
    if ((bVar14 | 0x20) == 0x69) {
      if ((opt & 4) == 0) {
        return STRSCAN_ERROR;
      }
      SVar5 = STRSCAN_IMAG;
      pbVar10 = pbVar19 + 1;
    }
    else {
      pbVar10 = pbVar19;
      if (SVar5 == STRSCAN_INT) {
        bVar22 = (bVar14 | 0x20) == 0x75;
        SVar5 = bVar22 + STRSCAN_INT;
        pbVar10 = pbVar19 + bVar22;
        if ((pbVar19[bVar22] & 0xdf) == 0x4c) {
          if ((pbVar10[1] & 0xdf) == 0x4c) {
            pbVar10 = pbVar10 + 2;
          }
          else {
            if ((opt & 0x10) == 0) {
              return STRSCAN_ERROR;
            }
            pbVar10 = pbVar10 + 1;
          }
          SVar5 = bVar22 + STRSCAN_I64;
        }
        if (((*pbVar10 & 0xdf) == 0x55) && ((SVar5 == STRSCAN_I64 || (SVar5 == STRSCAN_INT)))) {
          pbVar10 = pbVar10 + 1;
          SVar5 = SVar5 + STRSCAN_NUM;
        }
        if (((opt & 0x10) == 0) && (SVar5 == STRSCAN_U32)) {
          return STRSCAN_ERROR;
        }
        if (((opt & 8) == 0) && (STRSCAN_U32 < SVar5)) {
          return STRSCAN_ERROR;
        }
      }
    }
    pbVar19 = pbVar10 + -1;
    do {
      pbVar10 = pbVar19 + 1;
      pbVar19 = pbVar19 + 1;
    } while ((""[(ulong)*pbVar10 + 1] & 2) != 0);
    if (*pbVar10 != 0) {
      return STRSCAN_ERROR;
    }
  }
  if (pbVar19 < pbVar12) {
    return STRSCAN_ERROR;
  }
  if ((SVar5 == STRSCAN_INT) && (uVar20 == 10)) {
    if ((dig < 10) || (((dig == 10 && ((byte)uVar13 < 0x33)) && (uVar21 < local_48 + 0x80000000))))
    {
      if ((opt & 2) != 0) {
        lVar24 = (lua_Number)uVar21;
        if (local_48 != 0) {
          lVar24 = (lua_Number)((ulong)lVar24 | (ulong)DAT_0015e9a0);
        }
        o->n = lVar24;
        return STRSCAN_NUM;
      }
      if ((local_48 == 0) || (uVar21 != 0)) {
        uVar6 = -uVar21;
        if (local_48 == 0) {
          uVar6 = uVar21;
        }
        (o->u32).lo = uVar6;
        return STRSCAN_INT;
      }
      uVar8 = 0x8000000000000000;
LAB_0011b528:
      o->u64 = uVar8;
      return STRSCAN_NUM;
    }
  }
  else {
    if ((uVar20 == 0) && (1 < SVar5 - STRSCAN_NUM)) {
      SVar5 = strscan_oct(p,o,SVar5,local_48,dig);
      return SVar5;
    }
    if (uVar20 == 2) {
      SVar5 = strscan_bin(p,o,SVar5,opt,ex2,local_48,dig);
      goto LAB_0011b653;
    }
    if (uVar20 == 0x10) {
      SVar5 = strscan_hex(p,o,SVar5,opt,ex2,local_48,dig);
      goto LAB_0011b653;
    }
  }
  SVar5 = strscan_dec(p,o,SVar5,opt,ex2,local_48,dig);
LAB_0011b653:
  if ((opt & 1) == 0) {
    return SVar5;
  }
  if (SVar5 != STRSCAN_NUM) {
    return SVar5;
  }
  dVar1 = o->n;
  if (dVar1 != (double)(int)dVar1) {
    return STRSCAN_NUM;
  }
  if (!NAN(dVar1) && !NAN((double)(int)dVar1)) {
    (o->u32).lo = (int)dVar1;
    return STRSCAN_INT;
  }
  return STRSCAN_NUM;
}

Assistant:

StrScanFmt lj_strscan_scan(const uint8_t *p, MSize len, TValue *o,
			   uint32_t opt)
{
  int32_t neg = 0;
  const uint8_t *pe = p + len;

  /* Remove leading space, parse sign and non-numbers. */
  if (LJ_UNLIKELY(!lj_char_isdigit(*p))) {
    while (lj_char_isspace(*p)) p++;
    if (*p == '+' || *p == '-') neg = (*p++ == '-');
    if (LJ_UNLIKELY(*p >= 'A')) {  /* Parse "inf", "infinity" or "nan". */
      TValue tmp;
      setnanV(&tmp);
      if (casecmp(p[0],'i') && casecmp(p[1],'n') && casecmp(p[2],'f')) {
	if (neg) setminfV(&tmp); else setpinfV(&tmp);
	p += 3;
	if (casecmp(p[0],'i') && casecmp(p[1],'n') && casecmp(p[2],'i') &&
	    casecmp(p[3],'t') && casecmp(p[4],'y')) p += 5;
      } else if (casecmp(p[0],'n') && casecmp(p[1],'a') && casecmp(p[2],'n')) {
	p += 3;
      }
      while (lj_char_isspace(*p)) p++;
      if (*p || p < pe) return STRSCAN_ERROR;
      o->u64 = tmp.u64;
      return STRSCAN_NUM;
    }
  }

  /* Parse regular number. */
  {
    StrScanFmt fmt = STRSCAN_INT;
    int cmask = LJ_CHAR_DIGIT;
    int base = (opt & STRSCAN_OPT_C) && *p == '0' ? 0 : 10;
    const uint8_t *sp, *dp = NULL;
    uint32_t dig = 0, hasdig = 0, x = 0;
    int32_t ex = 0;

    /* Determine base and skip leading zeros. */
    if (LJ_UNLIKELY(*p <= '0')) {
      if (*p == '0') {
	if (casecmp(p[1], 'x'))
	  base = 16, cmask = LJ_CHAR_XDIGIT, p += 2;
	else if (casecmp(p[1], 'b'))
	  base = 2, cmask = LJ_CHAR_DIGIT, p += 2;
      }
      for ( ; ; p++) {
	if (*p == '0') {
	  hasdig = 1;
	} else if (*p == '.') {
	  if (dp) return STRSCAN_ERROR;
	  dp = p;
	} else {
	  break;
	}
      }
    }

    /* Preliminary digit and decimal point scan. */
    for (sp = p; ; p++) {
      if (LJ_LIKELY(lj_char_isa(*p, cmask))) {
	x = x * 10 + (*p & 15);  /* For fast path below. */
	dig++;
      } else if (*p == '.') {
	if (dp) return STRSCAN_ERROR;
	dp = p;
      } else {
	break;
      }
    }
    if (!(hasdig | dig)) return STRSCAN_ERROR;

    /* Handle decimal point. */
    if (dp) {
      if (base == 2) return STRSCAN_ERROR;
      fmt = STRSCAN_NUM;
      if (dig) {
	ex = (int32_t)(dp-(p-1)); dp = p-1;
	while (ex < 0 && *dp-- == '0') ex++, dig--;  /* Skip trailing zeros. */
	if (ex <= -STRSCAN_MAXEXP) return STRSCAN_ERROR;
	if (base == 16) ex *= 4;
      }
    }

    /* Parse exponent. */
    if (base >= 10 && casecmp(*p, (uint32_t)(base == 16 ? 'p' : 'e'))) {
      uint32_t xx;
      int negx = 0;
      fmt = STRSCAN_NUM; p++;
      if (*p == '+' || *p == '-') negx = (*p++ == '-');
      if (!lj_char_isdigit(*p)) return STRSCAN_ERROR;
      xx = (*p++ & 15);
      while (lj_char_isdigit(*p)) {
	xx = xx * 10 + (*p & 15);
	if (xx >= STRSCAN_MAXEXP) return STRSCAN_ERROR;
	p++;
      }
      ex += negx ? (int32_t)(~xx+1u) : (int32_t)xx;
    }

    /* Parse suffix. */
    if (*p) {
      /* I (IMAG), U (U32), LL (I64), ULL/LLU (U64), L (long), UL/LU (ulong). */
      /* NYI: f (float). Not needed until cp_number() handles non-integers. */
      if (casecmp(*p, 'i')) {
	if (!(opt & STRSCAN_OPT_IMAG)) return STRSCAN_ERROR;
	p++; fmt = STRSCAN_IMAG;
      } else if (fmt == STRSCAN_INT) {
	if (casecmp(*p, 'u')) p++, fmt = STRSCAN_U32;
	if (casecmp(*p, 'l')) {
	  p++;
	  if (casecmp(*p, 'l')) p++, fmt += STRSCAN_I64 - STRSCAN_INT;
	  else if (!(opt & STRSCAN_OPT_C)) return STRSCAN_ERROR;
	  else if (sizeof(long) == 8) fmt += STRSCAN_I64 - STRSCAN_INT;
	}
	if (casecmp(*p, 'u') && (fmt == STRSCAN_INT || fmt == STRSCAN_I64))
	  p++, fmt += STRSCAN_U32 - STRSCAN_INT;
	if ((fmt == STRSCAN_U32 && !(opt & STRSCAN_OPT_C)) ||
	    (fmt >= STRSCAN_I64 && !(opt & STRSCAN_OPT_LL)))
	  return STRSCAN_ERROR;
      }
      while (lj_char_isspace(*p)) p++;
      if (*p) return STRSCAN_ERROR;
    }
    if (p < pe) return STRSCAN_ERROR;

    /* Fast path for decimal 32 bit integers. */
    if (fmt == STRSCAN_INT && base == 10 &&
	(dig < 10 || (dig == 10 && *sp <= '2' && x < 0x80000000u+neg))) {
      if ((opt & STRSCAN_OPT_TONUM)) {
	o->n = neg ? -(double)x : (double)x;
	return STRSCAN_NUM;
      } else if (x == 0 && neg) {
	o->n = -0.0;
	return STRSCAN_NUM;
      } else {
	o->i = neg ? (int32_t)(~x+1u) : (int32_t)x;
	return STRSCAN_INT;
      }
    }

    /* Dispatch to base-specific parser. */
    if (base == 0 && !(fmt == STRSCAN_NUM || fmt == STRSCAN_IMAG))
      return strscan_oct(sp, o, fmt, neg, dig);
    if (base == 16)
      fmt = strscan_hex(sp, o, fmt, opt, ex, neg, dig);
    else if (base == 2)
      fmt = strscan_bin(sp, o, fmt, opt, ex, neg, dig);
    else
      fmt = strscan_dec(sp, o, fmt, opt, ex, neg, dig);

    /* Try to convert number to integer, if requested. */
    if (fmt == STRSCAN_NUM && (opt & STRSCAN_OPT_TOINT) && !tvismzero(o)) {
      double n = o->n;
      int32_t i = lj_num2int(n);
      if (n == (lua_Number)i) { o->i = i; return STRSCAN_INT; }
    }
    return fmt;
  }
}